

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

value * mjs::string_match(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                         string *str,value *regexp)

{
  void *pvVar1;
  regexp_object *prVar2;
  gc_heap_ptr_untyped *this;
  long *plVar3;
  undefined8 *puVar4;
  uint32_t index;
  uint uVar5;
  double dVar6;
  gc_heap_ptr<mjs::regexp_object> re;
  object_ptr res;
  value match;
  gc_heap_ptr_untyped local_110;
  string *local_100;
  double local_f8;
  gc_heap_ptr_untyped local_f0;
  value *local_e0;
  gc_heap *local_d8;
  undefined8 local_d0;
  wchar_t *local_c8;
  wstring_view local_c0;
  wstring local_b0;
  gc_heap_ptr_untyped local_90;
  value local_80;
  value local_58;
  
  local_100 = str;
  anon_unknown_35::to_regexp_object((anon_unknown_35 *)&local_110,global,regexp);
  pvVar1 = gc_heap_ptr_untyped::get(&local_110);
  if ((*(byte *)((long)pvVar1 + 0x38) & 1) == 0) {
    prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_110);
    regexp_object::exec(__return_storage_ptr__,prVar2,local_100);
  }
  else {
    prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_110);
    regexp_object::last_index(prVar2,0);
    make_array((gc_heap_ptr<mjs::global_object> *)&local_f0,(uint32_t)global);
    pvVar1 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    local_d8 = *(gc_heap **)((long)pvVar1 + 8);
    uVar5 = 0;
    local_e0 = __return_storage_ptr__;
    while( true ) {
      prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_110);
      local_f8 = regexp_object::last_index(prVar2);
      prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_110);
      regexp_object::exec(&local_80,prVar2,local_100);
      if (local_80.type_ != object) break;
      this = &value::object_value(&local_80)->super_gc_heap_ptr_untyped;
      plVar3 = (long *)gc_heap_ptr_untyped::get(&local_f0);
      index_string_abi_cxx11_(&local_b0,(mjs *)(ulong)uVar5,index);
      local_c0._M_len = local_b0._M_string_length;
      local_c0._M_str = local_b0._M_dataplus._M_p;
      string::string((string *)&local_90,local_d8,&local_c0);
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(this);
      local_d0 = 1;
      local_c8 = L"0";
      (**(code **)*puVar4)(&local_58,puVar4,&local_d0);
      (**(code **)(*plVar3 + 8))(plVar3,&local_90,&local_58,0);
      value::~value(&local_58);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
      std::__cxx11::wstring::~wstring((wstring *)&local_b0);
      prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_110);
      dVar6 = regexp_object::last_index(prVar2);
      if ((local_f8 == dVar6) && (!NAN(local_f8) && !NAN(dVar6))) {
        prVar2 = (regexp_object *)gc_heap_ptr_untyped::get(&local_110);
        regexp_object::last_index(prVar2,(uint32_t)(long)(local_f8 + 1.0));
      }
      value::~value(&local_80);
      uVar5 = uVar5 + 1;
    }
    if (local_80.type_ != null) {
      __assert_fail("match.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                    ,0x1af,
                    "value mjs::string_match(const gc_heap_ptr<global_object> &, const string &, const value &)"
                   );
    }
    value::~value(&local_80);
    __return_storage_ptr__ = local_e0;
    value::value(local_e0,(object_ptr *)&local_f0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f0);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  return __return_storage_ptr__;
}

Assistant:

value string_match(const gc_heap_ptr<global_object>& global, const string& str, const value& regexp) {
    auto re = to_regexp_object(global, regexp);
    if ((re->flags() & regexp_flag::global) == regexp_flag::none) {
        return re->exec(str);
    }
    // Global regexp
    re->last_index(0);

    auto res = make_array(global, 0);
    auto& h = global->heap();
    for (uint32_t i=0;; ++i) {
        const auto last_index_before = re->last_index();
        auto match = re->exec(str);
        if (match.type() == value_type::null) {
            break;
        }
        assert(match.type() == value_type::object);
        const auto& match_object = match.object_value();
        res->put(string{h, index_string(i)}, match_object->get(L"0"));
        if (last_index_before == re->last_index()) {
            // Empty match
            re->last_index(static_cast<uint32_t>(last_index_before + 1));
        }
    }
    return value{res};
}